

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_TestShell::createTest
          (TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_TestShell *this)

{
  Utest *this_00;
  TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x1f9);
  TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_Test::
  TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_Test
            ((TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, removingCopiersWorksHierachically)
{
    MockFailureReporterInstaller failureReporterInstaller;
    MyTypeForTesting object(1);

    MyTypeForTestingCopier copier;

    mock("scope").installCopier("MyTypeForTesting", copier);
    mock().removeAllComparatorsAndCopiers();
    mock("scope").expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &object);
    mock("scope").actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "bar", &object);

    MockNoWayToCopyCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}